

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# univalue_write.cpp
# Opt level: O1

void __thiscall UniValue::writeObject(UniValue *this,uint prettyIndent,uint indentLevel,string *s)

{
  pointer pUVar1;
  bool bVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  undefined8 uVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  long in_FS_OFFSET;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  size_type *local_58;
  _Alloc_hider local_50;
  size_type local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_40;
  
  aStack_40._8_8_ = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append(s,"{");
  if (prettyIndent != 0) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append(s,"\n");
  }
  if ((this->keys).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->keys).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar8 = 0;
    uVar9 = 1;
    do {
      if (prettyIndent != 0) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        _M_replace_aux(s,s->_M_string_length,0,(ulong)(indentLevel * prettyIndent),' ');
      }
      json_escape(&local_98,
                  (this->keys).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + uVar8);
      pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               replace(&local_98,0,0,"\"",1);
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(pbVar3->_M_dataplus)._M_p;
      paVar5 = &pbVar3->field_2;
      if (paVar6 == paVar5) {
        local_78.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
        local_78.field_2._8_8_ = *(undefined8 *)((long)&pbVar3->field_2 + 8);
      }
      else {
        local_78.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
        local_78._M_dataplus._M_p = (pointer)paVar6;
      }
      local_78._M_string_length = pbVar3->_M_string_length;
      (pbVar3->_M_dataplus)._M_p = (pointer)paVar5;
      pbVar3->_M_string_length = 0;
      (pbVar3->field_2)._M_local_buf[0] = '\0';
      pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&local_78,"\":");
      local_58 = (size_type *)(pbVar3->_M_dataplus)._M_p;
      paVar6 = &pbVar3->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58 == paVar6) {
        local_48 = paVar6->_M_allocated_capacity;
        aStack_40._M_allocated_capacity = *(size_type *)((long)&pbVar3->field_2 + 8);
        local_58 = &local_48;
      }
      else {
        local_48 = paVar6->_M_allocated_capacity;
      }
      local_50._M_p = (pointer)pbVar3->_M_string_length;
      (pbVar3->_M_dataplus)._M_p = (pointer)paVar6;
      pbVar3->_M_string_length = 0;
      (pbVar3->field_2)._M_local_buf[0] = '\0';
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                (s,(char *)local_58,(size_type)local_50._M_p);
      if (local_58 != &local_48) {
        operator_delete(local_58,local_48 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      if (prettyIndent != 0) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (s," ");
      }
      pUVar1 = (this->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar7 = ((long)(this->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)pUVar1 >> 3) * 0x2e8ba2e8ba2e8ba3;
      if (uVar7 < uVar8 || uVar7 - uVar8 == 0) {
        if (*(long *)(in_FS_OFFSET + 0x28) == aStack_40._8_8_) {
          uVar4 = std::__throw_out_of_range_fmt
                            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                             ,uVar8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != &local_98.field_2) {
            operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
          }
          if (*(long *)(in_FS_OFFSET + 0x28) == aStack_40._8_8_) {
            _Unwind_Resume(uVar4);
          }
        }
        goto LAB_00113ad3;
      }
      write_abi_cxx11_((UniValue *)&local_58,(int)pUVar1 + (int)uVar8 * 0x58,
                       (void *)(ulong)prettyIndent,(ulong)(indentLevel + 1));
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                (s,(char *)local_58,(size_type)local_50._M_p);
      if (local_58 != &local_48) {
        operator_delete(local_58,local_48 + 1);
      }
      if (((long)(this->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(this->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                 super__Vector_impl_data._M_start >> 3) * 0x2e8ba2e8ba2e8ba3 - 1U != uVar8) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (s,",");
      }
      if (prettyIndent != 0) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (s,"\n");
      }
      bVar2 = uVar9 < (ulong)((long)(this->keys).
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->keys).
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 5);
      uVar8 = uVar9;
      uVar9 = (ulong)((int)uVar9 + 1);
    } while (bVar2);
  }
  if (prettyIndent != 0) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace_aux
              (s,s->_M_string_length,0,(ulong)((indentLevel - 1) * prettyIndent),' ');
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append(s,"}");
  if (*(long *)(in_FS_OFFSET + 0x28) == aStack_40._8_8_) {
    return;
  }
LAB_00113ad3:
  __stack_chk_fail();
}

Assistant:

void UniValue::writeObject(unsigned int prettyIndent, unsigned int indentLevel, std::string& s) const
{
    s += "{";
    if (prettyIndent)
        s += "\n";

    for (unsigned int i = 0; i < keys.size(); i++) {
        if (prettyIndent)
            indentStr(prettyIndent, indentLevel, s);
        s += "\"" + json_escape(keys[i]) + "\":";
        if (prettyIndent)
            s += " ";
        s += values.at(i).write(prettyIndent, indentLevel + 1);
        if (i != (values.size() - 1))
            s += ",";
        if (prettyIndent)
            s += "\n";
    }

    if (prettyIndent)
        indentStr(prettyIndent, indentLevel - 1, s);
    s += "}";
}